

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
readServiceLevel(void *handle,UA_NodeId nodeid,UA_Boolean sourceTimeStamp,UA_NumericRange *range,
                UA_DataValue *value)

{
  byte bVar1;
  undefined1 *puVar2;
  undefined1 local_28 [8];
  timeval tv;
  
  if (range == (UA_NumericRange *)0x0) {
    (value->value).type = (UA_DataType *)0x13f410;
    (value->value).arrayLength = 0;
    puVar2 = (undefined1 *)calloc(1,1);
    *puVar2 = 0xff;
    (value->value).data = puVar2;
    (value->value).arrayDimensionsSize = 0;
    (value->value).arrayDimensions = (UA_UInt32 *)0x0;
    bVar1 = *(byte *)value;
    *(byte *)value = bVar1 | 1;
    if (sourceTimeStamp) {
      *(byte *)value = bVar1 | 5;
      gettimeofday((timeval *)local_28,(__timezone_ptr_t)0x0);
      value->sourceTimestamp = (long)local_28 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
    }
  }
  else {
    *(byte *)value = *(byte *)value | 2;
    value->status = 0x80360000;
  }
  return 0;
}

Assistant:

static UA_StatusCode
readServiceLevel(void *handle, const UA_NodeId nodeid, UA_Boolean sourceTimeStamp,
           const UA_NumericRange *range, UA_DataValue *value) {
    if(range) {
        value->hasStatus = true;
        value->status = UA_STATUSCODE_BADINDEXRANGEINVALID;
        return UA_STATUSCODE_GOOD;
    }

    value->value.type = &UA_TYPES[UA_TYPES_BYTE];
    value->value.arrayLength = 0;
    UA_Byte *byte = UA_Byte_new();
    *byte = 255;
    value->value.data = byte;
    value->value.arrayDimensionsSize = 0;
    value->value.arrayDimensions = NULL;
    value->hasValue = true;
    if(sourceTimeStamp) {
        value->hasSourceTimestamp = true;
        value->sourceTimestamp = UA_DateTime_now();
    }
    return UA_STATUSCODE_GOOD;
}